

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O0

Forms * __thiscall curlpp::HttpPost::getList_abi_cxx11_(HttpPost *this)

{
  bool bVar1;
  list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  *in_RSI;
  Forms *in_RDI;
  const_iterator pos;
  Forms *newForm;
  list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  *in_stack_ffffffffffffff88;
  Forms *__x;
  iterator local_40;
  _List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_> local_38;
  iterator local_30;
  _List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_> local_28;
  _List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_> local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  std::__cxx11::
  list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ::list((list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
          *)0x14bd6f);
  std::_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_>::_List_const_iterator(&local_20);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
       ::begin(in_stack_ffffffffffffff88);
  std::_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_>::_List_const_iterator
            (&local_28,&local_30);
  local_20._M_node = local_28._M_node;
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
         ::end(in_stack_ffffffffffffff88);
    std::_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_>::_List_const_iterator
              (&local_38,&local_40);
    bVar1 = std::operator!=(&local_20,&local_38);
    if (!bVar1) break;
    std::_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_>::operator*
              ((_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_> *)in_RDI);
    std::__cxx11::
    list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
    ::push_back(in_RSI,(value_type *)__x);
    std::_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_>::operator++(&local_20,0);
  }
  return __x;
}

Assistant:

curlpp::Forms curlpp::HttpPost::getList()
{
  //I'm not sure cloning is absolutely necessary.
  Forms newForm;

  Forms::const_iterator pos;
  for(pos = mForms.begin(); pos != mForms.end(); pos++) 
    newForm.push_back(*pos);

  return newForm;
}